

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
* testing::
  A<std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>const&>
            (void)

{
  void *__s;
  Matcher<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
  *in_RDI;
  MatcherInterface<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
  *in_stack_ffffffffffffffd8;
  Matcher<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
  *this;
  
  this = in_RDI;
  __s = operator_new(8);
  memset(__s,0,8);
  internal::
  AnyMatcherImpl<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
  ::AnyMatcherImpl((AnyMatcherImpl<const_std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>_>_&>
                    *)this);
  MakeMatcher<std::tuple<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>const&>
            (in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }